

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.cc
# Opt level: O0

void __thiscall tvm::runtime::GraphRuntime::LoadParams(GraphRuntime *this,Stream *strm)

{
  pointer *this_00;
  bool bVar1;
  ostringstream *poVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference this_01;
  NDArray local_b50;
  NDArray temp;
  size_type local_9c0;
  LogCheckError local_9b8;
  LogCheckError _check_err_1;
  undefined1 local_9a8 [4];
  uint32_t eid;
  LogCheckError local_820;
  LogCheckError _check_err;
  size_type sStack_810;
  int in_idx;
  size_t i;
  ulong local_680;
  size_t size;
  uint64_t sz;
  undefined1 local_4e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  LogMessageFatal local_348;
  LogMessageFatal local_1b0;
  unsigned_long local_28;
  uint64_t reserved;
  uint64_t header;
  Stream *strm_local;
  GraphRuntime *this_local;
  
  header = (uint64_t)strm;
  strm_local = (Stream *)this;
  bVar1 = dmlc::Stream::Read<unsigned_long>(strm,&reserved);
  if (!bVar1) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
               ,0xa4);
    poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1b0);
    poVar3 = std::operator<<((ostream *)poVar2,"Check failed: strm->Read(&header)");
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Invalid parameters file format");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1b0);
  }
  if (reserved != 0xf7e58d4f05049cb7) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_348,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
               ,0xa6);
    poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_348);
    poVar3 = std::operator<<((ostream *)poVar2,"Check failed: header == kTVMNDArrayListMagic");
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Invalid parameters file format");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_348);
  }
  bVar1 = dmlc::Stream::Read<unsigned_long>((Stream *)header,&local_28);
  if (!bVar1) {
    this_00 = &names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
               ,0xa8);
    poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_((LogMessageFatal *)this_00);
    poVar3 = std::operator<<((ostream *)poVar2,"Check failed: strm->Read(&reserved)");
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Invalid parameters file format");
    dmlc::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)
               &names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_4e8);
  bVar1 = dmlc::Stream::Read<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((Stream *)header,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_4e8);
  if (!bVar1) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&sz,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
               ,0xac);
    poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_((LogMessageFatal *)&sz);
    poVar3 = std::operator<<((ostream *)poVar2,"Check failed: strm->Read(&names)");
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Invalid parameters file format");
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&sz);
  }
  dmlc::Stream::Read<unsigned_long>((Stream *)header,&size);
  local_680 = size;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4e8);
  if (size != sVar4) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&i,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
               ,0xb1);
    poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_((LogMessageFatal *)&i);
    poVar3 = std::operator<<((ostream *)poVar2,"Check failed: size == names.size()");
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"Invalid parameters file format");
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&i);
  }
  for (sStack_810 = 0; sStack_810 < local_680; sStack_810 = sStack_810 + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_4e8,sStack_810);
    _check_err.str._4_4_ = GetInputIndex(this,pvVar5);
    dmlc::LogCheck_GE((dmlc *)&local_820,_check_err.str._4_4_,0);
    bVar1 = dmlc::LogCheckError::operator_cast_to_bool(&local_820);
    if (bVar1) {
      dmlc::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_9a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                 ,0xb5);
      poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_((LogMessageFatal *)local_9a8);
      poVar3 = std::operator<<((ostream *)poVar2,"Check failed: ");
      poVar3 = std::operator<<(poVar3,"in_idx >= 0");
      poVar3 = std::operator<<(poVar3,(string *)local_820.str);
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = std::operator<<(poVar3,"Found param for non-existent input: ");
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_4e8,sStack_810);
      std::operator<<(poVar3,(string *)pvVar5);
      dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_9a8);
    }
    dmlc::LogCheckError::~LogCheckError(&local_820);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->input_nodes_,(long)_check_err.str._4_4_);
    _check_err_1.str._4_4_ = entry_id(this,*pvVar6,0);
    local_9c0 = std::vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>::size
                          (&this->data_entry_);
    dmlc::LogCheck_LT<unsigned_int,unsigned_long>
              ((dmlc *)&local_9b8,(uint *)((long)&_check_err_1.str + 4),&local_9c0);
    bVar1 = dmlc::LogCheckError::operator_cast_to_bool(&local_9b8);
    if (bVar1) {
      dmlc::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&temp,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                 ,0xb7);
      poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_((LogMessageFatal *)&temp);
      poVar3 = std::operator<<((ostream *)poVar2,"Check failed: ");
      poVar3 = std::operator<<(poVar3,"eid < data_entry_.size()");
      poVar3 = std::operator<<(poVar3,(string *)local_9b8.str);
      std::operator<<(poVar3,": ");
      dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&temp);
    }
    dmlc::LogCheckError::~LogCheckError(&local_9b8);
    NDArray::NDArray(&local_b50);
    NDArray::Load(&local_b50,(Stream *)header);
    this_01 = std::vector<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>::operator[]
                        (&this->data_entry_,(ulong)_check_err_1.str._4_4_);
    NDArray::CopyFrom(this_01,&local_b50);
    NDArray::~NDArray(&local_b50);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4e8);
  return;
}

Assistant:

void GraphRuntime::LoadParams(dmlc::Stream *strm) {
  uint64_t header, reserved;
  CHECK(strm->Read(&header))
      << "Invalid parameters file format";
  CHECK(header == kTVMNDArrayListMagic)
      << "Invalid parameters file format";
  CHECK(strm->Read(&reserved))
      << "Invalid parameters file format";

  std::vector<std::string> names;
  CHECK(strm->Read(&names))
      << "Invalid parameters file format";
  uint64_t sz;
  strm->Read(&sz);
  size_t size = static_cast<size_t>(sz);
  CHECK(size == names.size())
      << "Invalid parameters file format";
  for (size_t i = 0; i < size; ++i) {
    int in_idx = GetInputIndex(names[i]);
    CHECK_GE(in_idx, 0) << "Found param for non-existent input: " << names[i];
    uint32_t eid = this->entry_id(input_nodes_[in_idx], 0);
    CHECK_LT(eid, data_entry_.size());

    // The data_entry is allocated on device, NDArray.load always load the array into CPU.
    NDArray temp;
    temp.Load(strm);

    /* [RISCV-DLR] Write all data_entry */
#ifdef weight_dump
    size_t shape_size = 1;
    for (int64_t sz : attrs_.shape[in_idx]) {
      shape_size *= static_cast<size_t>(sz);
    }
    std::ofstream out_("./module/" + names[i], std::ios::out | std::ios::binary);
    if (!out_)
      assert(0);
    DLDataType t = tvm::runtime::String2TVMType(attrs_.dltype[in_idx]);
    size_t bits = t.bits * t.lanes;
    CHECK(bits % 8U == 0U || bits == 1U);
    size_t bytes = ((bits + 7U) / 8U) * shape_size;
    out_.write((char *)((*temp.operator->()).data), bytes);
    out_.close();
#endif
    data_entry_[eid].CopyFrom(temp);
  }
}